

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int uv_async_send(uv_async_t *handle)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  size_t __n;
  char *__buf;
  
  if (handle->pending == 0) {
    LOCK();
    iVar3 = handle->pending;
    if (iVar3 == 0) {
      handle->pending = 1;
      iVar3 = 0;
    }
    UNLOCK();
    if (iVar3 == 0) {
      iVar3 = handle->loop->async_wfd;
      if (iVar3 == -1) {
        iVar3 = (handle->loop->async_io_watcher).fd;
        __buf = "\x01";
        __n = 8;
      }
      else {
        __buf = "";
        __n = 1;
      }
      do {
        sVar1 = write(iVar3,__buf,__n);
        if ((int)sVar1 != -1) {
          if ((long)(int)sVar1 == __n) {
            return 0;
          }
          goto LAB_004f6e6a;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      if (*piVar2 != 0xb) {
LAB_004f6e6a:
        abort();
      }
    }
  }
  return 0;
}

Assistant:

int uv_async_send(uv_async_t* handle) {
  /* Do a cheap read first. */
  if (ACCESS_ONCE(int, handle->pending) != 0)
    return 0;

  if (cmpxchgi(&handle->pending, 0, 1) == 0)
    uv__async_send(handle->loop);

  return 0;
}